

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
libcellml::Generator::GeneratorImpl::addExternNlaSolveMethodCode(GeneratorImpl *this)

{
  bool bVar1;
  element_type *peVar2;
  byte local_a5;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  byte local_31;
  string local_30;
  GeneratorImpl *local_10;
  GeneratorImpl *this_local;
  
  local_10 = this;
  bVar1 = modelHasNlas(this);
  local_31 = 0;
  local_a5 = 0;
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::externNlaSolveMethodString_abi_cxx11_(&local_30,peVar2);
    local_31 = 1;
    local_a5 = std::__cxx11::string::empty();
    local_a5 = local_a5 ^ 0xff;
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((local_a5 & 1) != 0) {
    newLineIfNeeded_abi_cxx11_(&local_78,this);
    peVar2 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::externNlaSolveMethodString_abi_cxx11_(&local_98,peVar2);
    std::operator+(&local_58,&local_78,&local_98);
    std::__cxx11::string::operator+=((string *)&this->mCode,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addExternNlaSolveMethodCode()
{
    if (modelHasNlas()
        && !mProfile->externNlaSolveMethodString().empty()) {
        mCode += newLineIfNeeded()
                 + mProfile->externNlaSolveMethodString();
    }
}